

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void gen_spr_401_403(CPUPPCState_conflict2 *env)

{
  CPUPPCState_conflict2 *env_local;
  
  _spr_register(env,0x3cc,"TBL",spr_read_tbl,spr_noaccess,spr_read_tbl,spr_noaccess,spr_read_tbl,
                spr_noaccess,0);
  _spr_register(env,0x3dc,"TBL",spr_noaccess,spr_noaccess,spr_noaccess,spr_write_tbl,spr_noaccess,
                spr_write_tbl,0);
  _spr_register(env,0x3cd,"TBU",spr_read_tbu,spr_noaccess,spr_read_tbu,spr_noaccess,spr_read_tbu,
                spr_noaccess,0);
  _spr_register(env,0x3dd,"TBU",spr_noaccess,spr_noaccess,spr_noaccess,spr_write_tbu,spr_noaccess,
                spr_write_tbu,0);
  _spr_register(env,0x3d7,"CDBCR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  return;
}

Assistant:

static void gen_spr_401_403(CPUPPCState *env)
{
    /* Time base */
    spr_register(env, SPR_403_VTBL,  "TBL",
                 &spr_read_tbl, SPR_NOACCESS,
                 &spr_read_tbl, SPR_NOACCESS,
                 0x00000000);
    spr_register(env, SPR_403_TBL,   "TBL",
                 SPR_NOACCESS, SPR_NOACCESS,
                 SPR_NOACCESS, &spr_write_tbl,
                 0x00000000);
    spr_register(env, SPR_403_VTBU,  "TBU",
                 &spr_read_tbu, SPR_NOACCESS,
                 &spr_read_tbu, SPR_NOACCESS,
                 0x00000000);
    spr_register(env, SPR_403_TBU,   "TBU",
                 SPR_NOACCESS, SPR_NOACCESS,
                 SPR_NOACCESS, &spr_write_tbu,
                 0x00000000);
    /* Debug */
    /* not emulated, as QEMU do not emulate caches */
    spr_register(env, SPR_403_CDBCR, "CDBCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
}